

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_index.cpp
# Opt level: O3

void generateDataFile(char *data_file)

{
  long lVar1;
  undefined1 *puVar2;
  FILE *__s;
  int iVar3;
  uint64_t val_size;
  uint64_t key_size;
  stringstream ss;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined1 *local_1d8;
  size_t local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  long local_1a8;
  string local_1a0 [8];
  long alStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  __s = fopen(data_file,"wb");
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar3 = 0;
  do {
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
    std::__cxx11::stringbuf::str(local_1a0);
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0]);
    }
    local_1e0 = 8;
    fwrite(&local_1e0,8,1,__s);
    *(long *)((long)alStack_198 + *(long *)(local_1a8 + -0x18)) = (long)(int)local_1e0;
    lVar1 = *(long *)(local_1a8 + -0x18);
    if (acStack_c8[lVar1 + 1] == '\0') {
      std::ios::widen((char)&local_1a8 + (char)lVar1);
      acStack_c8[lVar1 + 1] = '\x01';
    }
    acStack_c8[lVar1] = '0';
    std::ostream::operator<<((ostream *)&local_1a8,iVar3);
    std::__cxx11::stringbuf::str();
    puVar2 = local_208[0];
    std::__cxx11::stringbuf::str();
    fwrite(puVar2,local_1d0,1,__s);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0]);
    }
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"kv_value","");
    std::__cxx11::stringbuf::str(local_1a0);
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0]);
    }
    local_1e8 = 8;
    fwrite(&local_1e8,8,1,__s);
    *(long *)((long)alStack_198 + *(long *)(local_1a8 + -0x18)) = (long)(int)local_1e8;
    lVar1 = *(long *)(local_1a8 + -0x18);
    if (acStack_c8[lVar1 + 1] == '\0') {
      std::ios::widen((char)&local_1a8 + (char)lVar1);
      acStack_c8[lVar1 + 1] = '\x01';
    }
    acStack_c8[lVar1] = '0';
    std::ostream::operator<<((ostream *)&local_1a8,iVar3);
    std::__cxx11::stringbuf::str();
    puVar2 = local_208[0];
    std::__cxx11::stringbuf::str();
    fwrite(puVar2,local_1d0,1,__s);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0]);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  fclose(__s);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void generateDataFile(const char* data_file)
{
    FILE* f = fopen(data_file, "wb");

    stringstream ss;

    for (int i = 0; i < 100000; i++)
    {
        ss.str("");
        uint64_t key_size = 8;
        fwrite(&key_size, sizeof(key_size), 1, f);
        ss << setw(key_size) << setfill('0') << i;
        fwrite(ss.str().c_str(), ss.str().size(), 1, f);

        ss.str("kv_value");
        uint64_t val_size = 8;
        fwrite(&val_size, sizeof(val_size), 1, f);
        ss << setw(val_size) << setfill('0') << i;
        fwrite(ss.str().c_str(), ss.str().size(), 1, f);
    }

    fclose(f);
}